

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O0

pair<bool,_bool> __thiscall
hanabi_learning_env::HanabiState::AddToFireworks(HanabiState *this,HanabiCard card)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *pvVar3;
  reference pvVar4;
  HanabiGame *this_00;
  HanabiCard in_RDI;
  HanabiState *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  value_type vVar5;
  bool local_26;
  bool local_25;
  bool local_24;
  bool local_23;
  bool local_22;
  bool local_21 [21];
  HanabiCard local_c;
  pair<bool,_bool> local_2;
  
  bVar1 = CardPlayableOnFireworks
                    ((HanabiState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                     in_RDI);
  if (bVar1) {
    pvVar3 = (vector<int,_std::allocator<int>_> *)((long)in_RDI + 0x80);
    iVar2 = HanabiCard::Color(&local_c);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)iVar2);
    *pvVar4 = *pvVar4 + 1;
    pvVar3 = (vector<int,_std::allocator<int>_> *)((long)in_RDI + 0x80);
    iVar2 = HanabiCard::Color(&local_c);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar3,(long)iVar2);
    vVar5 = *pvVar4;
    this_00 = ParentGame((HanabiState *)in_RDI);
    iVar2 = HanabiGame::NumRanks(this_00);
    if (vVar5 == iVar2) {
      local_21[0] = true;
      local_22 = IncrementInformationTokens
                           ((HanabiState *)CONCAT44(vVar5,in_stack_ffffffffffffffc8));
      std::pair<bool,_bool>::pair<bool,_bool,_true>(&local_2,local_21,&local_22);
    }
    else {
      local_23 = true;
      local_24 = false;
      std::pair<bool,_bool>::pair<bool,_bool,_true>(&local_2,&local_23,&local_24);
    }
  }
  else {
    DecrementLifeTokens(in_stack_ffffffffffffffc0);
    local_25 = false;
    local_26 = false;
    std::pair<bool,_bool>::pair<bool,_bool,_true>(&local_2,&local_25,&local_26);
  }
  return local_2;
}

Assistant:

std::pair<bool, bool> HanabiState::AddToFireworks(HanabiCard card) {
  if (CardPlayableOnFireworks(card)) {
    ++fireworks_[card.Color()];
    // Check if player completed a stack.
    if (fireworks_[card.Color()] == ParentGame()->NumRanks()) {
      return {true, IncrementInformationTokens()};
    }
    return {true, false};
  } else {
    DecrementLifeTokens();
    return {false, false};
  }
}